

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_wallmarks::~xr_scene_wallmarks(xr_scene_wallmarks *this)

{
  xr_scene_wallmarks *this_local;
  
  (this->super_xr_scene_part)._vptr_xr_scene_part = (_func_int **)&PTR__xr_scene_wallmarks_0038e108;
  delete_elements<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>>
            (&this->m_slots);
  std::vector<xray_re::wm_slot_le_*,_std::allocator<xray_re::wm_slot_le_*>_>::~vector
            (&this->m_slots);
  std::__cxx11::string::~string((string *)&this->m_texture);
  std::__cxx11::string::~string((string *)&this->m_shader);
  xr_scene_part::~xr_scene_part(&this->super_xr_scene_part);
  return;
}

Assistant:

xr_scene_wallmarks::~xr_scene_wallmarks()
{
	delete_elements(m_slots);
}